

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void Js::DynamicProfileInfo::GetSourceAndFunctionId
               (FunctionBody *functionBody,FunctionInfo *calleeFunctionInfo,
               JavascriptFunction *calleeFunction,SourceId *sourceId,LocalFunctionId *functionId)

{
  FunctionProxy *this;
  code *pcVar1;
  bool bVar2;
  SourceId SVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  ScriptContext *pSVar6;
  DWORD_PTR DVar7;
  DWORD_PTR DVar8;
  Type TVar9;
  
  if (sourceId == (SourceId *)0x0 || functionId == (LocalFunctionId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x281,"(sourceId != nullptr && functionId != nullptr)",
                                "sourceId != nullptr && functionId != nullptr");
    if (!bVar2) goto LAB_009600d5;
    *puVar4 = 0;
  }
  *sourceId = 0xfffffffc;
  if (calleeFunction == (JavascriptFunction *)0x0) {
    TVar9 = 0xfffffffd;
  }
  else {
    this = (calleeFunctionInfo->functionBodyImpl).ptr;
    pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    if (this == (FunctionProxy *)0x0) {
      TVar9 = 0xfffffffe;
      if (pSVar5 != (((((calleeFunction->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
      goto LAB_009600c0;
      *sourceId = 0xfffffffe;
    }
    else {
      pSVar6 = FunctionProxy::GetScriptContext(this);
      TVar9 = 0xfffffffe;
      if (pSVar5 != pSVar6) goto LAB_009600c0;
      DVar7 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
      DVar8 = FunctionProxy::GetSecondaryHostSourceContext(this);
      if (DVar7 == DVar8) {
        DVar7 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
        DVar8 = FunctionProxy::GetHostSourceContext(this);
        SVar3 = 0xfffffffd;
        if (DVar7 != DVar8) {
          DVar7 = FunctionProxy::GetHostSourceContext(this);
          SVar3 = (SourceId)DVar7;
        }
        *sourceId = SVar3;
      }
      else {
        DVar7 = FunctionProxy::GetHostSourceContext(this);
        if (DVar7 != 0xfffffffffffffffe) goto LAB_009600c0;
        *sourceId = 0xfffffffb;
      }
      calleeFunctionInfo = (this->functionInfo).ptr;
      if (calleeFunctionInfo == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) {
LAB_009600d5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        calleeFunctionInfo = (this->functionInfo).ptr;
      }
    }
    TVar9 = calleeFunctionInfo->functionId;
  }
LAB_009600c0:
  *functionId = TVar9;
  return;
}

Assistant:

void DynamicProfileInfo::GetSourceAndFunctionId(FunctionBody * functionBody, FunctionInfo* calleeFunctionInfo, JavascriptFunction * calleeFunction, Js::SourceId * sourceId, Js::LocalFunctionId * functionId)
    {
        Assert(sourceId != nullptr && functionId != nullptr);

        *sourceId = InvalidSourceId;

        if (calleeFunction == nullptr)
        {
            *functionId = CallSiteNonFunction;
            return;
        }

        if (!calleeFunctionInfo->HasBody())
        {
            if (functionBody->GetScriptContext() == calleeFunction->GetScriptContext())
            {
                *sourceId = BuiltInSourceId;
                *functionId = calleeFunctionInfo->GetLocalFunctionId();
            }
            else
            {
                *functionId = CallSiteCrossContext;
            }
            return;
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now
        FunctionProxy * calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();
        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                if (functionBody->GetHostSourceContext() == calleeFunctionProxy->GetHostSourceContext())
                {
                    *sourceId = CurrentSourceId; // Caller and callee in same file
                }
                else
                {
                    *sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext(); // Caller and callee in different files
                }
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else if (calleeFunctionProxy->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
            {
                *sourceId = JsBuiltInSourceId;
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else
            {
                // Pretend that we are cross context when call is crossing script file.
                *functionId = CallSiteCrossContext;
            }
        }
        else
        {
            *functionId = CallSiteCrossContext;
        }
    }